

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O3

int32_t getHangulSyllableType(IntProperty *param_1,UChar32 c,UProperty param_3)

{
  uint32_t uVar1;
  uint uVar2;
  UHangulSyllableType UVar3;
  
  uVar1 = u_getUnicodeProperties_63(c,2);
  uVar2 = uVar1 >> 5 & 0x1f;
  UVar3 = U_HST_NOT_APPLICABLE;
  if (uVar2 < 10) {
    UVar3 = gcbToHst[uVar2];
  }
  return UVar3;
}

Assistant:

static int32_t getHangulSyllableType(const IntProperty &/*prop*/, UChar32 c, UProperty /*which*/) {
    /* see comments on gcbToHst[] above */
    int32_t gcb=(int32_t)(u_getUnicodeProperties(c, 2)&UPROPS_GCB_MASK)>>UPROPS_GCB_SHIFT;
    if(gcb<UPRV_LENGTHOF(gcbToHst)) {
        return gcbToHst[gcb];
    } else {
        return U_HST_NOT_APPLICABLE;
    }
}